

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# impute.hpp
# Opt level: O0

void apply_imputation_results<std::vector<ImputedData<int,double>,std::allocator<ImputedData<int,double>>>,InputData<double,int>>
               (vector<ImputedData<int,_double>,_std::allocator<ImputedData<int,_double>_>_>
                *impute_vec,Imputer *imputer,InputData<double,_int> *input_data,int nthreads)

{
  double dVar1;
  uint uVar2;
  size_type __n;
  reference pvVar3;
  reference pvVar4;
  reference pvVar5;
  reference pvVar6;
  difference_type dVar7;
  reference this;
  reference pvVar8;
  long *in_RDX;
  long in_RSI;
  vector<ImputedData<int,_double>,_std::allocator<ImputedData<int,_double>_>_> *in_RDI;
  size_t ix_2;
  size_t ix_1;
  size_t row_1;
  int ix;
  size_t col_1;
  size_t row;
  vector<unsigned_long,_std::allocator<unsigned_long>_> row_pos;
  size_t col;
  vector<double,_std::allocator<double>_> *this_00;
  allocator_type *in_stack_ffffffffffffff08;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> __last;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_ffffffffffffff10;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_ffffffffffffff18;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffff20;
  value_type vVar9;
  vector<double,_std::allocator<double>_> *local_90;
  double *local_88;
  ulong local_80;
  int local_74;
  ulong local_70;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_40;
  value_type local_28;
  long *local_18;
  long local_10;
  vector<ImputedData<int,_double>,_std::allocator<ImputedData<int,_double>_>_> *local_8;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  if (in_RDX[0xd] != 0) {
    std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x2758a8);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              (in_stack_ffffffffffffff20,(size_type)in_stack_ffffffffffffff18._M_current,
               (value_type_conflict1 *)in_stack_ffffffffffffff10._M_current,
               in_stack_ffffffffffffff08);
    std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x2758d6);
    for (local_70 = 0; local_70 < (ulong)local_18[1]; local_70 = local_70 + 1) {
      for (local_74 = *(int *)(local_18[0xd] + local_70 * 4);
          local_74 < *(int *)(local_18[0xd] + 4 + local_70 * 4); local_74 = local_74 + 1) {
        uVar2 = std::isnan(*(double *)(local_18[0xb] + (long)local_74 * 8));
        if (((uVar2 & 1) != 0) ||
           (uVar2 = std::isinf(*(double *)(local_18[0xb] + (long)local_74 * 8)), (uVar2 & 1) != 0))
        {
          __n = (size_type)*(int *)(local_18[0xc] + (long)local_74 * 4);
          pvVar3 = std::vector<ImputedData<int,_double>,_std::allocator<ImputedData<int,_double>_>_>
                   ::operator[](local_8,__n);
          pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                             (&local_40,__n);
          pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                             (&pvVar3->sp_num_weight,*pvVar4);
          if (*pvVar5 <= 0.0) {
LAB_00275b70:
            pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                               ((vector<double,_std::allocator<double>_> *)(local_10 + 0x40),
                                local_70);
            *(value_type *)(local_18[0xb] + (long)local_74 * 8) = *pvVar5;
          }
          else {
            pvVar3 = std::
                     vector<ImputedData<int,_double>,_std::allocator<ImputedData<int,_double>_>_>::
                     operator[](local_8,__n);
            pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                               (&local_40,__n);
            pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                               (&pvVar3->sp_num_sum,*pvVar4);
            uVar2 = std::isnan(*pvVar5);
            if ((uVar2 & 1) != 0) goto LAB_00275b70;
            pvVar3 = std::
                     vector<ImputedData<int,_double>,_std::allocator<ImputedData<int,_double>_>_>::
                     operator[](local_8,__n);
            pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                               (&local_40,__n);
            pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                               (&pvVar3->sp_num_sum,*pvVar4);
            uVar2 = std::isinf(*pvVar5);
            if ((uVar2 & 1) != 0) goto LAB_00275b70;
            pvVar3 = std::
                     vector<ImputedData<int,_double>,_std::allocator<ImputedData<int,_double>_>_>::
                     operator[](local_8,__n);
            in_stack_ffffffffffffff10._M_current = (double *)&pvVar3->sp_num_sum;
            pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                               (&local_40,__n);
            pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                               ((vector<double,_std::allocator<double>_> *)
                                in_stack_ffffffffffffff10._M_current,*pvVar4);
            vVar9 = *pvVar5;
            pvVar3 = std::
                     vector<ImputedData<int,_double>,_std::allocator<ImputedData<int,_double>_>_>::
                     operator[](local_8,__n);
            in_stack_ffffffffffffff18._M_current = (double *)&pvVar3->sp_num_weight;
            pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                               (&local_40,__n);
            pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                               ((vector<double,_std::allocator<double>_> *)
                                in_stack_ffffffffffffff18._M_current,*pvVar4);
            *(double *)(local_18[0xb] + (long)local_74 * 8) = vVar9 / *pvVar5;
          }
          pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                             (&local_40,__n);
          *pvVar4 = *pvVar4 + 1;
        }
      }
    }
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               in_stack_ffffffffffffff10._M_current);
  }
  local_80 = 0;
  do {
    if ((ulong)local_18[6] <= local_80) {
      return;
    }
    pvVar6 = std::vector<char,_std::allocator<char>_>::operator[]
                       ((vector<char,_std::allocator<char>_> *)(local_18 + 0x13),local_80);
    if (*pvVar6 != '\0') {
      local_88 = (double *)0x0;
      while (__last._M_current = local_88,
            pvVar3 = std::
                     vector<ImputedData<int,_double>,_std::allocator<ImputedData<int,_double>_>_>::
                     operator[](local_8,local_80),
            __last._M_current < (double *)pvVar3->n_missing_num) {
        pvVar3 = std::vector<ImputedData<int,_double>,_std::allocator<ImputedData<int,_double>_>_>::
                 operator[](local_8,local_80);
        pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (&pvVar3->missing_num,(size_type)local_88);
        local_28 = *pvVar4;
        pvVar3 = std::vector<ImputedData<int,_double>,_std::allocator<ImputedData<int,_double>_>_>::
                 operator[](local_8,local_80);
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&pvVar3->num_weight,(size_type)local_88);
        if (*pvVar5 <= 0.0) {
LAB_00275e04:
          pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(local_10 + 0x40),local_28)
          ;
          *(value_type *)(*local_18 + (local_80 + local_28 * local_18[6]) * 8) = *pvVar5;
        }
        else {
          pvVar3 = std::vector<ImputedData<int,_double>,_std::allocator<ImputedData<int,_double>_>_>
                   ::operator[](local_8,local_80);
          pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                             (&pvVar3->num_sum,(size_type)local_88);
          uVar2 = std::isnan(*pvVar5);
          if ((uVar2 & 1) != 0) goto LAB_00275e04;
          pvVar3 = std::vector<ImputedData<int,_double>,_std::allocator<ImputedData<int,_double>_>_>
                   ::operator[](local_8,local_80);
          pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                             (&pvVar3->num_sum,(size_type)local_88);
          uVar2 = std::isinf(*pvVar5);
          if ((uVar2 & 1) != 0) goto LAB_00275e04;
          pvVar3 = std::vector<ImputedData<int,_double>,_std::allocator<ImputedData<int,_double>_>_>
                   ::operator[](local_8,local_80);
          pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                             (&pvVar3->num_sum,(size_type)local_88);
          dVar1 = *pvVar5;
          pvVar3 = std::vector<ImputedData<int,_double>,_std::allocator<ImputedData<int,_double>_>_>
                   ::operator[](local_8,local_80);
          pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                             (&pvVar3->num_weight,(size_type)local_88);
          *(double *)(*local_18 + (local_80 + local_28 * local_18[6]) * 8) = dVar1 / *pvVar5;
        }
        local_88 = (double *)((long)local_88 + 1);
      }
      local_90 = (vector<double,_std::allocator<double>_> *)0x0;
      while (this_00 = local_90,
            pvVar3 = std::
                     vector<ImputedData<int,_double>,_std::allocator<ImputedData<int,_double>_>_>::
                     operator[](local_8,local_80),
            this_00 < (vector<double,_std::allocator<double>_> *)pvVar3->n_missing_cat) {
        pvVar3 = std::vector<ImputedData<int,_double>,_std::allocator<ImputedData<int,_double>_>_>::
                 operator[](local_8,local_80);
        pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (&pvVar3->missing_cat,(size_type)local_90);
        local_28 = *pvVar4;
        pvVar3 = std::vector<ImputedData<int,_double>,_std::allocator<ImputedData<int,_double>_>_>::
                 operator[](local_8,local_80);
        std::
        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ::operator[](&pvVar3->cat_sum,local_28);
        std::vector<double,_std::allocator<double>_>::begin(this_00);
        pvVar3 = std::vector<ImputedData<int,_double>,_std::allocator<ImputedData<int,_double>_>_>::
                 operator[](local_8,local_80);
        std::
        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ::operator[](&pvVar3->cat_sum,local_28);
        std::vector<double,_std::allocator<double>_>::begin(this_00);
        pvVar3 = std::vector<ImputedData<int,_double>,_std::allocator<ImputedData<int,_double>_>_>::
                 operator[](local_8,local_80);
        std::
        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ::operator[](&pvVar3->cat_sum,local_28);
        std::vector<double,_std::allocator<double>_>::end(this_00);
        std::
        max_element<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
                  (in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
        dVar7 = std::
                distance<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
                          (in_stack_ffffffffffffff10,__last);
        *(int *)(local_18[2] + (local_80 + local_28 * local_18[6]) * 4) = (int)dVar7;
        if (*(int *)(local_18[2] + (local_80 + local_28 * local_18[6]) * 4) == 0) {
          pvVar3 = std::vector<ImputedData<int,_double>,_std::allocator<ImputedData<int,_double>_>_>
                   ::operator[](local_8,local_80);
          this = std::
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ::operator[](&pvVar3->cat_sum,local_28);
          pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](this,0);
          if (*pvVar5 <= 0.0) {
            pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                               ((vector<int,_std::allocator<int>_> *)(local_10 + 0x58),local_28);
            *(value_type *)(local_18[2] + (local_80 + local_28 * local_18[6]) * 4) = *pvVar8;
          }
        }
        local_90 = (vector<double,_std::allocator<double>_> *)
                   ((long)&(local_90->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                           super__Vector_impl_data._M_start + 1);
      }
    }
    local_80 = local_80 + 1;
  } while( true );
}

Assistant:

void apply_imputation_results(imp_arr    &impute_vec,
                              Imputer    &imputer,
                              InputData  &input_data,
                              int        nthreads)
{
    size_t col;

    if (input_data.Xc_indptr != NULL)
    {
        std::vector<size_t> row_pos(input_data.nrows, 0);
        size_t row;

        for (size_t col = 0; col < input_data.ncols_numeric; col++)
        {
            for (auto ix = input_data.Xc_indptr[col]; ix < input_data.Xc_indptr[col + 1]; ix++)
            {
                if (is_na_or_inf(input_data.Xc[ix]))
                {
                    row = input_data.Xc_ind[ix];
                    if (impute_vec[row].sp_num_weight[row_pos[row]] > 0 && !is_na_or_inf(impute_vec[row].sp_num_sum[row_pos[row]]))
                        input_data.Xc[ix]
                            =
                        impute_vec[row].sp_num_sum[row_pos[row]]
                            /
                        impute_vec[row].sp_num_weight[row_pos[row]];
                    else
                        input_data.Xc[ix]
                            =
                        imputer.col_means[col];

                    row_pos[row]++;
                }
            }
        }
    }

    #pragma omp parallel for schedule(dynamic) num_threads(nthreads) shared(input_data, impute_vec, imputer) private(col)
    for (size_t_for row = 0; row < (decltype(row))input_data.nrows; row++)
    {
        if (input_data.has_missing[row])
        {
            for (size_t ix = 0; ix < impute_vec[row].n_missing_num; ix++)
            {
                col = impute_vec[row].missing_num[ix];
                if (impute_vec[row].num_weight[ix] > 0 && !is_na_or_inf(impute_vec[row].num_sum[ix]))
                    input_data.numeric_data[row + col * input_data.nrows]
                        =
                    impute_vec[row].num_sum[ix] / impute_vec[row].num_weight[ix];
                else
                    input_data.numeric_data[row + col * input_data.nrows]
                        =
                    imputer.col_means[col];
            }

            for (size_t ix = 0; ix < impute_vec[row].n_missing_cat; ix++)
            {
                col = impute_vec[row].missing_cat[ix];
                input_data.categ_data[row + col * input_data.nrows]
                    =
                std::distance(impute_vec[row].cat_sum[col].begin(),
                              std::max_element(impute_vec[row].cat_sum[col].begin(),
                                                 impute_vec[row].cat_sum[col].end()));

                if (input_data.categ_data[row + col * input_data.nrows] == 0 && impute_vec[row].cat_sum[col][0] <= 0)
                    input_data.categ_data[row + col * input_data.nrows]
                        =
                    imputer.col_modes[col];
            }
        }
    }
}